

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool __thiscall picojson::default_parse_context::set_bool(default_parse_context *this,bool b)

{
  value local_20;
  
  local_20.type_ = 1;
  local_20.u_.boolean_ = b;
  value::operator=(this->out_,&local_20);
  value::~value(&local_20);
  return true;
}

Assistant:

bool set_bool(bool b) {
      *out_ = value(b);
      return true;
    }